

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CFG::
walk_from<diligent_spirv_cross::Compiler::analyze_variable_scope(diligent_spirv_cross::SPIRFunction&,diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
          (CFG *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *seen_blocks,uint32_t block,anon_class_16_2_2fc8764d *op)

{
  bool bVar1;
  size_type sVar2;
  SmallVector<unsigned_int,_8UL> *this_00;
  uint *puVar3;
  uint b;
  uint *__end3;
  uint *__begin3;
  SmallVector<unsigned_int,_8UL> *__range3;
  anon_class_16_2_2fc8764d *op_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puStack_18;
  uint32_t block_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *seen_blocks_local;
  CFG *this_local;
  
  op_local._4_4_ = block;
  puStack_18 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)seen_blocks;
  seen_blocks_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)this;
  sVar2 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)seen_blocks,(key_type *)((long)&op_local + 4));
  if (sVar2 == 0) {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(puStack_18,(value_type *)((long)&op_local + 4));
    bVar1 = Compiler::analyze_variable_scope::anon_class_16_2_2fc8764d::operator()
                      (op,op_local._4_4_);
    if (bVar1) {
      this_00 = get_succeeding_edges(this,op_local._4_4_);
      __end3 = VectorView<unsigned_int>::begin(&this_00->super_VectorView<unsigned_int>);
      puVar3 = VectorView<unsigned_int>::end(&this_00->super_VectorView<unsigned_int>);
      for (; __end3 != puVar3; __end3 = __end3 + 1) {
        walk_from<diligent_spirv_cross::Compiler::analyze_variable_scope(diligent_spirv_cross::SPIRFunction&,diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
                  (this,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)puStack_18,*__end3,op);
      }
    }
  }
  return;
}

Assistant:

void walk_from(std::unordered_set<uint32_t> &seen_blocks, uint32_t block, const Op &op) const
	{
		if (seen_blocks.count(block))
			return;
		seen_blocks.insert(block);

		if (op(block))
		{
			for (auto b : get_succeeding_edges(block))
				walk_from(seen_blocks, b, op);
		}
	}